

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O2

Own<capnp::compiler::BrandScope,_std::nullptr_t> __thiscall
capnp::compiler::BrandScope::push(BrandScope *this,uint64_t typeId,uint paramCount)

{
  undefined4 in_register_00000014;
  BrandScope *extraout_RDX;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> OVar1;
  uint local_24;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> local_20;
  unsigned_long local_10;
  
  local_10 = CONCAT44(in_register_00000014,paramCount);
  *(int *)(typeId + 8) = *(int *)(typeId + 8) + 1;
  local_20.disposer = (Disposer *)typeId;
  local_20.ptr = (BrandScope *)typeId;
  kj::
  refcounted<capnp::compiler::BrandScope,kj::Own<capnp::compiler::BrandScope,decltype(nullptr)>,unsigned_long&,unsigned_int&>
            ((kj *)this,&local_20,&local_10,&local_24);
  kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::dispose(&local_20);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<BrandScope> BrandScope::push(uint64_t typeId, uint paramCount) {
  return kj::refcounted<BrandScope>(kj::addRef(*this), typeId, paramCount);
}